

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::ImmutableExtensionGenerator
          (ImmutableExtensionGenerator *this,FieldDescriptor *descriptor,Context *context)

{
  ClassNameResolver *pCVar1;
  Descriptor *pDVar2;
  FileDescriptor *descriptor_00;
  string local_70;
  string local_50;
  Context *local_20;
  Context *context_local;
  FieldDescriptor *descriptor_local;
  ImmutableExtensionGenerator *this_local;
  
  local_20 = context;
  context_local = (Context *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  ExtensionGenerator::ExtensionGenerator(&this->super_ExtensionGenerator);
  (this->super_ExtensionGenerator)._vptr_ExtensionGenerator =
       (_func_int **)&PTR__ImmutableExtensionGenerator_006f5ba8;
  this->descriptor_ = (FieldDescriptor *)context_local;
  this->context_ = local_20;
  pCVar1 = Context::GetNameResolver(local_20);
  this->name_resolver_ = pCVar1;
  std::__cxx11::string::string((string *)&this->scope_);
  pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
  if (pDVar2 == (Descriptor *)0x0) {
    pCVar1 = this->name_resolver_;
    descriptor_00 = FieldDescriptor::file(this->descriptor_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&local_70,pCVar1,descriptor_00);
    std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    pCVar1 = this->name_resolver_;
    pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>(&local_50,pCVar1,pDVar2);
    std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

ImmutableExtensionGenerator::ImmutableExtensionGenerator(
    const FieldDescriptor* descriptor, Context* context)
  : descriptor_(descriptor), context_(context),
    name_resolver_(context->GetNameResolver()) {
  if (descriptor_->extension_scope() != NULL) {
    scope_ = name_resolver_->GetImmutableClassName(
        descriptor_->extension_scope());
  } else {
    scope_ = name_resolver_->GetImmutableClassName(descriptor_->file());
  }
}